

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

iterator * __thiscall boost::filesystem::path::begin(iterator *__return_storage_ptr__,path *this)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  string local_30 [32];
  
  (__return_storage_ptr__->m_element).m_pathname._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_element).m_pathname.field_2;
  (__return_storage_ptr__->m_element).m_pathname._M_string_length = 0;
  (__return_storage_ptr__->m_element).m_pathname.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->m_path_ptr = this;
  uVar1 = (this->m_pathname)._M_string_length;
  __return_storage_ptr__->m_pos = 0;
  if (uVar1 == 0) goto LAB_0010f4b5;
  pcVar2 = (this->m_pathname)._M_dataplus._M_p;
  if (uVar1 == 1) {
    if (*pcVar2 == '/') {
LAB_0010f473:
      for (uVar4 = 1; (uVar4 < uVar1 && (pcVar2[uVar4] == '/')); uVar4 = uVar4 + 1) {
        __return_storage_ptr__->m_pos = uVar4;
      }
      goto LAB_0010f4b5;
    }
LAB_0010f48a:
    uVar4 = 0;
  }
  else {
    if (*pcVar2 != '/') goto LAB_0010f48a;
    if ((pcVar2[1] != '/') || ((uVar4 = 2, uVar1 != 2 && (pcVar2[2] == '/')))) goto LAB_0010f473;
  }
  for (; (uVar4 < uVar1 && (pcVar2[uVar4] != '/')); uVar4 = uVar4 + 1) {
  }
LAB_0010f4b5:
  std::__cxx11::string::substr((ulong)local_30,(ulong)this);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::~string(local_30);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __return_storage_ptr__,"/");
  if (bVar3) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

path::iterator path::begin() const
  {
    iterator itr;
    itr.m_path_ptr = this;
    size_type element_size;
    first_element(m_pathname, itr.m_pos, element_size);
    itr.m_element = m_pathname.substr(itr.m_pos, element_size);
    if (itr.m_element.m_pathname == preferred_separator_string)
      itr.m_element.m_pathname = separator_string;  // needed for Windows, harmless on POSIX
    return itr;
  }